

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeStore
          (ScalarReplacementPass *this,Instruction *store,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Instruction *pIVar1;
  IRContext *pIVar2;
  ScalarReplacementPass *pSVar3;
  uint32_t uVar4;
  array<signed_char,_4UL> aVar5;
  Instruction *pIVar6;
  pointer pOVar7;
  mapped_type *ppBVar8;
  Operand *pOVar9;
  int iVar10;
  pointer ppIVar11;
  uint uVar12;
  long lVar13;
  SmallVector<unsigned_int,_2UL> *pSVar14;
  Operand *__cur;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar15;
  pointer ppIVar16;
  Operand *__cur_1;
  bool bVar17;
  iterator iter;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newStore;
  Operand copy;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> extract;
  iterator where;
  array<signed_char,_4UL> local_16c;
  iterator local_168;
  array<signed_char,_4UL> local_15c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_158;
  IRContext *local_138;
  Instruction *local_130;
  Instruction *local_128;
  undefined1 local_120 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_100;
  undefined1 local_f8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  array<signed_char,_4UL> local_d0;
  uint32_t local_cc;
  undefined1 local_c8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  undefined4 local_98;
  undefined1 local_90 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  BasicBlock *local_68;
  pointer local_60;
  ScalarReplacementPass *local_58;
  Instruction *local_50;
  Instruction *local_48;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_40;
  pointer local_38;
  
  uVar12 = (store->has_result_id_ & 1) + 1;
  if (store->has_type_id_ == false) {
    uVar12 = (uint)store->has_result_id_;
  }
  local_d0._M_elems = (_Type)Instruction::GetSingleWordOperand(store,uVar12 + 1);
  local_68 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,store);
  ppIVar16 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar11 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = ppIVar16 == ppIVar11;
  if (!bVar17) {
    local_16c._M_elems[0] = '\0';
    local_16c._M_elems[1] = '\0';
    local_16c._M_elems[2] = '\0';
    local_16c._M_elems[3] = '\0';
    local_60 = ppIVar11;
    local_58 = this;
    local_50 = store;
    local_40._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         store;
    do {
      pIVar1 = *ppIVar16;
      if (pIVar1->opcode_ == OpVariable) {
        pIVar6 = GetStorageType(this,pIVar1);
        local_15c._M_elems = (_Type)Pass::TakeNextId((Pass *)this);
        if (local_15c._M_elems == (_Type)0x0) {
          iVar10 = 1;
          ppIVar11 = local_60;
        }
        else {
          local_38 = ppIVar16;
          local_130 = (Instruction *)operator_new(0x70);
          local_138 = (this->super_MemPass).super_Pass.context_;
          uVar4 = 0;
          if (pIVar6->has_result_id_ == true) {
            uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
          }
          local_f8._0_8_ = &PTR__SmallVector_003e9b28;
          local_f8._24_8_ = local_f8 + 0x10;
          local_d8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_f8[0x10] = local_d0._M_elems[0];
          local_f8[0x11] = local_d0._M_elems[1];
          local_f8[0x12] = local_d0._M_elems[2];
          local_f8[0x13] = local_d0._M_elems[3];
          local_f8._8_8_ = 1;
          local_c8._0_4_ = 1;
          local_c8._8_8_ = &PTR__SmallVector_003e9b28;
          local_c8._16_8_ = 0;
          local_c8._32_8_ = local_c8 + 0x18;
          local_a0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          pSVar14 = (SmallVector<unsigned_int,_2UL> *)(local_c8 + 8);
          local_cc = uVar4;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (pSVar14,(SmallVector<unsigned_int,_2UL> *)local_f8);
          local_120._0_8_ = &PTR__SmallVector_003e9b28;
          local_120._24_8_ = local_120 + 0x10;
          local_100._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_120[0x10] = local_16c._M_elems[0];
          local_120[0x11] = local_16c._M_elems[1];
          local_120[0x12] = local_16c._M_elems[2];
          local_120[0x13] = local_16c._M_elems[3];
          local_120._8_8_ = 1;
          local_98 = 6;
          local_90._0_8_ = &PTR__SmallVector_003e9b28;
          local_90._8_8_ = 0;
          local_90._24_8_ = local_90 + 0x10;
          local_70._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)local_90,
                     (SmallVector<unsigned_int,_2UL> *)local_120);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar13 = 0x60;
          pOVar7 = (pointer)operator_new(0x60);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar7 + 2;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = pOVar7;
          do {
            pOVar7->type = *(spv_operand_type_t *)
                            &pSVar14[-1].large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
            (pOVar7->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
            (pOVar7->words).size_ = 0;
            (pOVar7->words).small_data_ = (uint *)(pOVar7->words).buffer;
            (pOVar7->words).large_data_._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar7->words,pSVar14);
            pIVar6 = local_130;
            pOVar7 = pOVar7 + 1;
            pSVar14 = (SmallVector<unsigned_int,_2UL> *)&pSVar14[1].size_;
            lVar13 = lVar13 + -0x30;
          } while (lVar13 != 0);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = pOVar7;
          Instruction::Instruction
                    (local_130,local_138,OpCompositeExtract,local_cc,(uint32_t)local_15c._M_elems,
                     &local_158);
          local_48 = pIVar6;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_158);
          pIVar6 = local_50;
          pSVar3 = local_58;
          lVar13 = -0x60;
          pdVar15 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                    &local_70;
          do {
            *(undefined ***)(pdVar15 + -0x20) = &PTR__SmallVector_003e9b28;
            if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar15 !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()(pdVar15,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar15);
            }
            *(undefined8 *)pdVar15 = 0;
            pdVar15 = pdVar15 + -0x30;
            lVar13 = lVar13 + 0x30;
          } while (lVar13 != 0);
          local_120._0_8_ = &PTR__SmallVector_003e9b28;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_100._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0
             ) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_100,local_100._M_head_impl);
          }
          local_f8._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_d8._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_d8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_d8._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          InstructionList::iterator::InsertBefore
                    ((iterator *)&local_168,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_40);
          Instruction::UpdateDebugInfoFrom(local_168.node_,pIVar6);
          pIVar2 = (pSVar3->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          analysis::DefUseManager::AnalyzeInstDefUse
                    ((pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,local_168.node_);
          pIVar2 = (pSVar3->super_MemPass).super_Pass.context_;
          local_c8._0_8_ = local_168.node_;
          if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
            ppBVar8 = std::__detail::
                      _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pIVar2->instr_to_block_,(key_type *)local_c8);
            *ppBVar8 = local_68;
          }
          local_130 = (Instruction *)operator_new(0x70);
          local_138 = (pSVar3->super_MemPass).super_Pass.context_;
          aVar5._M_elems[0] = '\0';
          aVar5._M_elems[1] = '\0';
          aVar5._M_elems[2] = '\0';
          aVar5._M_elems[3] = '\0';
          if (pIVar1->has_result_id_ == true) {
            aVar5._M_elems =
                 (_Type)Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
          }
          local_16c._M_elems = local_16c._M_elems + 1;
          local_f8._0_8_ = &PTR__SmallVector_003e9b28;
          local_f8._24_8_ = local_f8 + 0x10;
          local_d8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_f8._8_8_ = 1;
          local_c8._0_4_ = 1;
          local_c8._8_8_ = &PTR__SmallVector_003e9b28;
          local_c8._16_8_ = 0;
          local_c8._32_8_ = local_c8 + 0x18;
          local_a0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          pSVar14 = (SmallVector<unsigned_int,_2UL> *)(local_c8 + 8);
          local_f8._16_4_ = aVar5._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (pSVar14,(SmallVector<unsigned_int,_2UL> *)local_f8);
          local_120._0_8_ = &PTR__SmallVector_003e9b28;
          local_120._24_8_ = local_120 + 0x10;
          local_100._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_120[0x10] = local_15c._M_elems[0];
          local_120[0x11] = local_15c._M_elems[1];
          local_120[0x12] = local_15c._M_elems[2];
          local_120[0x13] = local_15c._M_elems[3];
          local_120._8_8_ = 1;
          local_98 = 1;
          local_90._0_8_ = &PTR__SmallVector_003e9b28;
          local_90._8_8_ = 0;
          local_90._24_8_ = local_90 + 0x10;
          local_70._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)local_90,
                     (SmallVector<unsigned_int,_2UL> *)local_120);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar13 = 0x60;
          pOVar7 = (pointer)operator_new(0x60);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar7 + 2;
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = pOVar7;
          do {
            pOVar7->type = *(spv_operand_type_t *)
                            &pSVar14[-1].large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
            (pOVar7->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
            (pOVar7->words).size_ = 0;
            (pOVar7->words).small_data_ = (uint *)(pOVar7->words).buffer;
            (pOVar7->words).large_data_._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar7->words,pSVar14);
            pIVar1 = local_130;
            pOVar7 = pOVar7 + 1;
            pSVar14 = (SmallVector<unsigned_int,_2UL> *)&pSVar14[1].size_;
            lVar13 = lVar13 + -0x30;
          } while (lVar13 != 0);
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = pOVar7;
          Instruction::Instruction(local_130,local_138,OpStore,0,0,&local_158);
          local_128 = pIVar1;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_158);
          pIVar1 = local_50;
          this = local_58;
          lVar13 = -0x60;
          pdVar15 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                    &local_70;
          do {
            *(undefined ***)(pdVar15 + -0x20) = &PTR__SmallVector_003e9b28;
            if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar15 !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()(pdVar15,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar15);
            }
            *(undefined8 *)pdVar15 = 0;
            pdVar15 = pdVar15 + -0x30;
            lVar13 = lVar13 + 0x30;
          } while (lVar13 != 0);
          local_120._0_8_ = &PTR__SmallVector_003e9b28;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_100._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0
             ) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_100,local_100._M_head_impl);
          }
          local_f8._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_d8._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_d8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_d8._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          uVar12 = (pIVar1->has_result_id_ & 1) + 1;
          if (pIVar1->has_type_id_ == false) {
            uVar12 = (uint)pIVar1->has_result_id_;
          }
          if (2 < (int)((ulong)((long)(pIVar1->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar1->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - uVar12) {
            uVar4 = 2;
            do {
              pOVar9 = Instruction::GetInOperand(pIVar1,uVar4);
              local_c8._0_4_ = pOVar9->type;
              local_c8._8_8_ = &PTR__SmallVector_003e9b28;
              local_c8._16_8_ = 0;
              local_a0._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_c8._32_8_ = local_c8 + 0x18;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&pOVar9->words);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              emplace_back<spvtools::opt::Operand>(&local_128->operands_,(Operand *)local_c8);
              local_c8._8_8_ = &PTR__SmallVector_003e9b28;
              if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )local_a0._M_t.
                    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                    ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_a0,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           local_a0._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl);
              }
              uVar4 = uVar4 + 1;
              uVar12 = (pIVar1->has_result_id_ & 1) + 1;
              if (pIVar1->has_type_id_ == false) {
                uVar12 = (uint)pIVar1->has_result_id_;
              }
            } while (uVar4 < (int)((ulong)((long)(pIVar1->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pIVar1->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555 - uVar12);
          }
          InstructionList::iterator::InsertBefore
                    ((iterator *)local_c8,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_40);
          local_168.node_ = (Instruction *)local_c8._0_8_;
          Instruction::UpdateDebugInfoFrom((Instruction *)local_c8._0_8_,pIVar1);
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          analysis::DefUseManager::AnalyzeInstDefUse
                    ((pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,local_168.node_);
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          local_c8._0_8_ = local_168.node_;
          if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
            ppBVar8 = std::__detail::
                      _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pIVar2->instr_to_block_,(key_type *)local_c8);
            *ppBVar8 = local_68;
          }
          ppIVar16 = local_38;
          if (local_128 != (Instruction *)0x0) {
            (*(local_128->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase[1])();
          }
          if (local_48 != (Instruction *)0x0) {
            (*(local_48->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase[1])();
          }
          iVar10 = 0;
          ppIVar11 = local_60;
        }
      }
      else {
        local_16c._M_elems = local_16c._M_elems + 1;
        iVar10 = 3;
      }
      if ((iVar10 != 3) && (iVar10 != 0)) {
        return bVar17;
      }
      ppIVar16 = ppIVar16 + 1;
      bVar17 = ppIVar16 == ppIVar11;
    } while (!bVar17);
  }
  return bVar17;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeStore(
    Instruction* store, const std::vector<Instruction*>& replacements) {
  // Replaces a store to the whole composite with a series of extract and stores
  // to each element.
  uint32_t storeInput = store->GetSingleWordInOperand(1u);
  BasicBlock* block = context()->get_instr_block(store);
  BasicBlock::iterator where(store);
  uint32_t elementIndex = 0;
  for (auto var : replacements) {
    // Create the extract.
    if (var->opcode() != spv::Op::OpVariable) {
      elementIndex++;
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t extractId = TakeNextId();
    if (extractId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> extract(new Instruction(
        context(), spv::Op::OpCompositeExtract, type->result_id(), extractId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {storeInput}},
            {SPV_OPERAND_TYPE_LITERAL_INTEGER, {elementIndex++}}}));
    auto iter = where.InsertBefore(std::move(extract));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);

    // Create the store.
    std::unique_ptr<Instruction> newStore(
        new Instruction(context(), spv::Op::OpStore, 0, 0,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                            {SPV_OPERAND_TYPE_ID, {extractId}}}));
    // Copy memory access attributes which start at index 2. Index 0 is the
    // pointer and index 1 is the data.
    for (uint32_t i = 2; i < store->NumInOperands(); ++i) {
      Operand copy(store->GetInOperand(i));
      newStore->AddOperand(std::move(copy));
    }
    iter = where.InsertBefore(std::move(newStore));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);
  }
  return true;
}